

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dec.c
# Opt level: O0

void TrueMotion(uint8_t *dst,int size)

{
  byte bVar1;
  byte bVar2;
  int x;
  uint8_t *clip;
  int y;
  uint8_t *clip0;
  uint8_t *top;
  int size_local;
  uint8_t *dst_local;
  
  bVar1 = dst[-0x21];
  dst_local = dst;
  for (y = 0; y < size; y = y + 1) {
    bVar2 = dst_local[-1];
    for (x = 0; x < size; x = x + 1) {
      dst_local[x] = ""[(ulong)dst[(long)x + -0x20] +
                        (long)(int)(uint)bVar2 + (0xff - (long)(int)(uint)bVar1)];
    }
    dst_local = dst_local + 0x20;
  }
  return;
}

Assistant:

static WEBP_INLINE void TrueMotion(uint8_t* dst, int size) {
  const uint8_t* top = dst - BPS;
  const uint8_t* const clip0 = VP8kclip1 - top[-1];
  int y;
  for (y = 0; y < size; ++y) {
    const uint8_t* const clip = clip0 + dst[-1];
    int x;
    for (x = 0; x < size; ++x) {
      dst[x] = clip[top[x]];
    }
    dst += BPS;
  }
}